

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_freetable(void **argtable,size_t n)

{
  size_t tabindex;
  size_t sVar1;
  
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    if (argtable[sVar1] != (void *)0x0) {
      free(argtable[sVar1]);
      argtable[sVar1] = (void *)0x0;
    }
  }
  return;
}

Assistant:

void arg_freetable(void** argtable, size_t n) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    size_t tabindex = 0;
    /*printf("arg_freetable(%p)\n",argtable);*/
    for (tabindex = 0; tabindex < n; tabindex++) {
        if (table[tabindex] == NULL)
            continue;

        xfree(table[tabindex]);
        table[tabindex] = NULL;
    };
}